

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<_IO_FILE*,long,unsigned_long>
               (TreesIndexer *model,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  bool bVar1;
  undefined4 in_ECX;
  vector<char,_std::allocator<char>_> *in_RDX;
  SingleTreeIndex *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  SingleTreeIndex *tree;
  iterator __end1;
  iterator __begin1;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range1;
  size_t vec_size;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  size_type in_stack_ffffffffffffffb8;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
  local_38;
  undefined8 local_30;
  byte local_1b;
  byte local_1a;
  byte local_19;
  undefined8 local_8;
  
  local_19 = (byte)in_ECX & 1;
  local_1a = (byte)in_R8D & 1;
  local_1b = in_R9B & 1;
  if (!interrupt_switch) {
    local_8 = in_RDI;
    read_bytes<unsigned_long,unsigned_long>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(FILE **)in_RSI,in_RDX,
               SUB41((uint)in_ECX >> 0x18,0));
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::shrink_to_fit
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)0x67cf67);
    local_30 = local_8;
    local_38._M_current =
         (SingleTreeIndex *)
         std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
                   ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                    CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)CONCAT44(in_ECX,in_R8D),
                              (__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
      ::operator*(&local_38);
      deserialize_node<_IO_FILE*,long,unsigned_long>
                (in_RSI,(_IO_FILE **)in_RDX,
                 (vector<char,_std::allocator<char>_> *)CONCAT44(in_ECX,in_R8D),
                 (bool)in_stack_ffffffffffffff9f);
      __gnu_cxx::
      __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void deserialize_model(TreesIndexer &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>(&vec_size, (size_t)1, in, buffer, diff_endian);
    model.indices.resize(vec_size);
    model.indices.shrink_to_fit();
    for (auto &tree : model.indices)
        deserialize_node<itype, saved_int_t, saved_size_t>(tree, in, buffer, diff_endian);
}